

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::shader_module_is_supported
          (Impl *this,VkShaderModuleCreateInfo *info)

{
  bool bVar1;
  
  if (info->flags == 0) {
    if (this->null_device != false) {
      return true;
    }
    bVar1 = validate_module_capabilities(this,info->pCode,info->codeSize);
    if (bVar1) {
      bVar1 = pnext_chain_is_supported(this,info->pNext);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::shader_module_is_supported(const VkShaderModuleCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkShaderModuleCreateFlags supported_flags = 0;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if (!validate_module_capabilities(info->pCode, info->codeSize))
		return false;

	return pnext_chain_is_supported(info->pNext);
}